

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O3

UText * __thiscall
icu_63::RegexMatcher::replaceAll
          (RegexMatcher *this,UText *replacement,UText *dest,UErrorCode *status)

{
  int64_t iVar1;
  UBool UVar2;
  UnicodeString emptyString;
  UText empty;
  UnicodeString local_f8;
  UText local_b8;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->fDeferredStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      if (dest == (UText *)0x0) {
        local_f8.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)&PTR__UnicodeString_00487e70;
        local_f8.fUnion.fStackFields.fLengthAndFlags = 2;
        memset(&local_b8,0,0x90);
        local_b8.magic = 0x345ad82c;
        local_b8.sizeOfStruct = 0x90;
        utext_openUnicodeString_63(&local_b8,&local_f8,status);
        dest = utext_clone_63((UText *)0x0,&local_b8,'\x01','\0',status);
        utext_close_63(&local_b8);
        icu_63::UnicodeString::~UnicodeString(&local_f8);
        if (U_ZERO_ERROR < *status) {
          return dest;
        }
      }
      this->fRegionStart = 0;
      iVar1 = this->fInputLength;
      this->fRegionLimit = iVar1;
      this->fActiveStart = 0;
      this->fActiveLimit = iVar1;
      this->fAnchorStart = 0;
      this->fAnchorLimit = iVar1;
      this->fLookStart = 0;
      this->fLookLimit = iVar1;
      this->fMatchStart = 0;
      this->fMatchEnd = 0;
      this->fLastMatchEnd = -1;
      this->fAppendPosition = 0;
      this->fMatch = '\0';
      this->fHitEnd = '\0';
      this->fRequireEnd = '\0';
      this->fTime = 0;
      this->fTickCounter = 10000;
      if (this->fDeferredStatus < U_ILLEGAL_ARGUMENT_ERROR) {
        do {
          local_b8.magic = 0;
          UVar2 = find(this,(UErrorCode *)&local_b8);
          if ((UVar2 == '\0') ||
             (appendReplacement(this,dest,replacement,status), U_ZERO_ERROR < *status)) break;
        } while (this->fDeferredStatus < U_ILLEGAL_ARGUMENT_ERROR);
      }
      appendTail(this,dest,status);
    }
    else {
      *status = this->fDeferredStatus;
    }
  }
  return dest;
}

Assistant:

UText *RegexMatcher::replaceAll(UText *replacement, UText *dest, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return dest;
    }
    if (U_FAILURE(fDeferredStatus)) {
        status = fDeferredStatus;
        return dest;
    }

    if (dest == NULL) {
        UnicodeString emptyString;
        UText empty = UTEXT_INITIALIZER;

        utext_openUnicodeString(&empty, &emptyString, &status);
        dest = utext_clone(NULL, &empty, TRUE, FALSE, &status);
        utext_close(&empty);
    }

    if (U_SUCCESS(status)) {
        reset();
        while (find()) {
            appendReplacement(dest, replacement, status);
            if (U_FAILURE(status)) {
                break;
            }
        }
        appendTail(dest, status);
    }

    return dest;
}